

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t sse4_despace_branchless_u2(char *bytes,size_t howmany)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar13[8] = 0x20;
  auVar13._0_8_ = 0x2020202020202020;
  auVar13[9] = 0x20;
  auVar13[10] = 0x20;
  auVar13[0xb] = 0x20;
  auVar13[0xc] = 0x20;
  auVar13[0xd] = 0x20;
  auVar13[0xe] = 0x20;
  auVar13[0xf] = 0x20;
  auVar14[8] = 10;
  auVar14._0_8_ = 0xa0a0a0a0a0a0a0a;
  auVar14[9] = 10;
  auVar14[10] = 10;
  auVar14[0xb] = 10;
  auVar14[0xc] = 10;
  auVar14[0xd] = 10;
  auVar14[0xe] = 10;
  auVar14[0xf] = 10;
  auVar15[8] = 0xd;
  auVar15._0_8_ = 0xd0d0d0d0d0d0d0d;
  auVar15[9] = 0xd;
  auVar15[10] = 0xd;
  auVar15[0xb] = 0xd;
  auVar15[0xc] = 0xd;
  auVar15[0xd] = 0xd;
  auVar15[0xe] = 0xd;
  auVar15[0xf] = 0xd;
  uVar11 = 0;
  sVar10 = 0;
  while (uVar11 + 0x1f < howmany) {
    auVar1 = *(undefined1 (*) [16])(bytes + uVar11);
    auVar2 = *(undefined1 (*) [16])(bytes + uVar11 + 0x10);
    uVar11 = uVar11 + 0x20;
    uVar4 = vpcmpeqb_avx512vl(auVar1,auVar13);
    uVar5 = vpcmpeqb_avx512vl(auVar1,auVar14);
    uVar6 = vpcmpeqb_avx512vl(auVar1,auVar15);
    uVar7 = vpcmpeqb_avx512vl(auVar2,auVar14);
    uVar8 = vpcmpeqb_avx512vl(auVar2,auVar13);
    uVar9 = (uint)(ushort)((ushort)uVar5 | (ushort)uVar4 | (ushort)uVar6);
    uVar4 = vpcmpeqb_avx512vl(auVar2,auVar15);
    auVar1 = vpshufb_avx(auVar1,*(undefined1 (*) [16])("" + ((uVar9 & 0x7fff) << 4)));
    lVar12 = (0x10 - POPCOUNT(uVar9)) + sVar10;
    *(undefined1 (*) [16])(bytes + sVar10) = auVar1;
    uVar9 = (uint)(ushort)((ushort)uVar7 | (ushort)uVar8 | (ushort)uVar4);
    auVar1 = vpshufb_avx(auVar2,*(undefined1 (*) [16])("" + ((uVar9 & 0x7fff) << 4)));
    sVar10 = (ulong)(0x10 - POPCOUNT(uVar9)) + lVar12;
    *(undefined1 (*) [16])(bytes + lVar12) = auVar1;
  }
  while (uVar11 + 0xf < howmany) {
    auVar1 = *(undefined1 (*) [16])(bytes + uVar11);
    uVar11 = uVar11 + 0x10;
    uVar4 = vpcmpeqb_avx512vl(auVar1,auVar13);
    uVar5 = vpcmpeqb_avx512vl(auVar1,auVar14);
    uVar6 = vpcmpeqb_avx512vl(auVar1,auVar15);
    uVar9 = (uint)(ushort)((ushort)uVar5 | (ushort)uVar4 | (ushort)uVar6);
    auVar1 = vpshufb_avx(auVar1,*(undefined1 (*) [16])("" + ((uVar9 & 0x7fff) << 4)));
    *(undefined1 (*) [16])(bytes + sVar10) = auVar1;
    sVar10 = sVar10 + (0x10 - POPCOUNT(uVar9));
  }
  for (; uVar11 < howmany; uVar11 = uVar11 + 1) {
    bVar3 = bytes[uVar11];
    if ((0x20 < (ulong)bVar3) || ((0x100002400U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
      bytes[sVar10] = bVar3;
      sVar10 = sVar10 + 1;
    }
  }
  return sVar10;
}

Assistant:

size_t sse4_despace_branchless_u2(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');
  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m128i x1 = _mm_loadu_si128((const __m128i *)(bytes + i));
    __m128i x2 = _mm_loadu_si128((const __m128i *)(bytes + i + 16));
    int mask16;
    x1 = cleanm128(x1, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x1);
    pos += 16 - _mm_popcnt_u32(mask16);

    x2 = cleanm128(x2, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x2);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = cleanm128(x, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}